

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

void ssh2_got_user_input(ConnectionLayer *cl)

{
  size_t sVar1;
  ptrlen pVar2;
  
  while( true ) {
    if (cl[-0xc].logctx == (LogContext *)0x0) {
      return;
    }
    sVar1 = bufchain_size((bufchain *)cl[-10].vt);
    if (sVar1 == 0) break;
    pVar2 = bufchain_prefix((bufchain *)cl[-10].vt);
    (**(code **)(cl[-0xc].vt)->rportfwd_alloc)(cl[-0xc].vt,0,pVar2.ptr,pVar2.len);
    bufchain_consume((bufchain *)cl[-10].vt,pVar2.len);
  }
  return;
}

Assistant:

static void ssh2_got_user_input(ConnectionLayer *cl)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);

    while (s->mainchan && bufchain_size(s->user_input) > 0) {
        /*
         * Add user input to the main channel's buffer.
         */
        ptrlen data = bufchain_prefix(s->user_input);
        sshfwd_write(s->mainchan_sc, data.ptr, data.len);
        bufchain_consume(s->user_input, data.len);
    }
}